

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O2

wchar_t systemf(char *fmt,...)

{
  char in_AL;
  wchar_t wVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buff [8192];
  undefined8 local_20d8;
  void **local_20d0;
  undefined1 *local_20c8;
  undefined1 local_20b8 [8];
  undefined8 local_20b0;
  undefined8 local_20a8;
  undefined8 local_20a0;
  undefined8 local_2098;
  undefined8 local_2090;
  undefined8 local_2088;
  undefined8 local_2078;
  undefined8 local_2068;
  undefined8 local_2058;
  undefined8 local_2048;
  undefined8 local_2038;
  undefined8 local_2028;
  undefined8 local_2018;
  char local_2008 [8200];
  
  local_20c8 = local_20b8;
  if (in_AL != '\0') {
    local_2088 = in_XMM0_Qa;
    local_2078 = in_XMM1_Qa;
    local_2068 = in_XMM2_Qa;
    local_2058 = in_XMM3_Qa;
    local_2048 = in_XMM4_Qa;
    local_2038 = in_XMM5_Qa;
    local_2028 = in_XMM6_Qa;
    local_2018 = in_XMM7_Qa;
  }
  local_20d0 = &ap[0].overflow_arg_area;
  local_20d8 = 0x3000000008;
  local_20b0 = in_RSI;
  local_20a8 = in_RDX;
  local_20a0 = in_RCX;
  local_2098 = in_R8;
  local_2090 = in_R9;
  vsnprintf(local_2008,0x2000,fmt,&local_20d8);
  if (L'\x02' < verbosity) {
    logprintf("Cmd: %s\n",local_2008);
  }
  wVar1 = system(local_2008);
  return wVar1;
}

Assistant:

int
systemf(const char *fmt, ...)
{
	char buff[8192];
	va_list ap;
	int r;

	va_start(ap, fmt);
	vsnprintf(buff, sizeof(buff), fmt, ap);
	if (verbosity > VERBOSITY_FULL)
		logprintf("Cmd: %s\n", buff);
	r = system(buff);
	va_end(ap);
	return (r);
}